

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactBvh.h
# Opt level: O1

bool __thiscall
cbtGImpactBvh::rayQuery
          (cbtGImpactBvh *this,cbtVector3 *ray_dir,cbtVector3 *ray_origin,
          cbtAlignedObjectArray<int> *collided_results)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  bool bVar18;
  int *piVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  
  iVar7 = *(int *)this;
  if (0 < iVar7) {
    iVar22 = 0;
    auVar25 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    auVar27 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    do {
      lVar20 = *(long *)(this + 0x18);
      lVar23 = (long)iVar22;
      fVar1 = *(float *)(lVar20 + 0x10 + lVar23 * 0x24);
      fVar2 = *(float *)(lVar20 + 0x14 + lVar23 * 0x24);
      fVar3 = *(float *)(lVar20 + 0x18 + lVar23 * 0x24);
      fVar14 = (fVar1 + *(float *)(lVar20 + lVar23 * 0x24)) * 0.5;
      fVar1 = fVar1 - fVar14;
      fVar14 = ray_origin->m_floats[0] - fVar14;
      auVar24 = auVar25._0_16_;
      auVar11 = vandps_avx(auVar24,ZEXT416((uint)fVar14));
      if ((auVar11._0_4_ <= fVar1) || (fVar14 * ray_dir->m_floats[0] < 0.0)) {
        fVar15 = (fVar2 + *(float *)(lVar20 + 4 + lVar23 * 0x24)) * 0.5;
        fVar2 = fVar2 - fVar15;
        fVar15 = ray_origin->m_floats[1] - fVar15;
        auVar11 = vandps_avx(auVar24,ZEXT416((uint)fVar15));
        if ((fVar2 < auVar11._0_4_) && (0.0 <= fVar15 * ray_dir->m_floats[1])) goto LAB_009236c5;
        fVar16 = (fVar3 + *(float *)(lVar20 + 8 + lVar23 * 0x24)) * 0.5;
        fVar3 = fVar3 - fVar16;
        fVar16 = ray_origin->m_floats[2] - fVar16;
        auVar11 = vandps_avx(auVar24,ZEXT416((uint)fVar16));
        if ((fVar3 < auVar11._0_4_) && (0.0 <= fVar16 * ray_dir->m_floats[2])) goto LAB_009236c5;
        fVar4 = ray_dir->m_floats[1];
        fVar5 = ray_dir->m_floats[2];
        auVar11 = vfmsub231ss_fma(ZEXT416((uint)(fVar5 * fVar15)),ZEXT416((uint)fVar4),
                                  ZEXT416((uint)fVar16));
        auVar26 = auVar27._0_16_;
        auVar11 = vandps_avx(auVar26,auVar11);
        auVar12 = vandps_avx(ZEXT416((uint)fVar5),auVar26);
        auVar13 = vandps_avx(auVar26,ZEXT416((uint)fVar4));
        auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * auVar13._0_4_)),ZEXT416((uint)fVar2),
                                  auVar12);
        if (auVar17._0_4_ < auVar11._0_4_) goto LAB_009236c5;
        fVar6 = ray_dir->m_floats[0];
        auVar11 = vfmsub213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar14),
                                  ZEXT416((uint)(fVar6 * fVar16)));
        auVar11 = vandps_avx(auVar11,auVar26);
        auVar17 = vandps_avx(ZEXT416((uint)fVar6),auVar26);
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * auVar17._0_4_)),ZEXT416((uint)fVar1),
                                  auVar12);
        if (auVar12._0_4_ < auVar11._0_4_) goto LAB_009236c5;
        auVar11 = vfmsub213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)fVar6),
                                  ZEXT416((uint)(fVar14 * fVar4)));
        auVar11 = vandps_avx(auVar24,auVar11);
        auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * auVar17._0_4_)),ZEXT416((uint)fVar1),
                                  auVar13);
        bVar18 = auVar11._0_4_ <= auVar24._0_4_;
      }
      else {
LAB_009236c5:
        bVar18 = false;
      }
      iVar8 = *(int *)(lVar20 + 0x20 + lVar23 * 0x24);
      if ((bVar18) && (-1 < iVar8)) {
        iVar9 = collided_results->m_size;
        if (iVar9 == collided_results->m_capacity) {
          iVar21 = iVar9 * 2;
          if (iVar9 == 0) {
            iVar21 = 1;
          }
          if (collided_results->m_capacity < iVar21) {
            if (iVar21 == 0) {
              piVar19 = (int *)0x0;
            }
            else {
              piVar19 = (int *)cbtAlignedAllocInternal((long)iVar21 << 2,0x10);
            }
            iVar9 = collided_results->m_size;
            if (0 < (long)iVar9) {
              piVar10 = collided_results->m_data;
              lVar20 = 0;
              do {
                piVar19[lVar20] = piVar10[lVar20];
                lVar20 = lVar20 + 1;
              } while (iVar9 != lVar20);
            }
            auVar25 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            auVar27 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            if (collided_results->m_data != (int *)0x0) {
              if (collided_results->m_ownsMemory == true) {
                cbtAlignedFreeInternal(collided_results->m_data);
                auVar27 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                auVar25 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
              }
              collided_results->m_data = (int *)0x0;
            }
            collided_results->m_ownsMemory = true;
            collided_results->m_data = piVar19;
            collided_results->m_capacity = iVar21;
          }
        }
        collided_results->m_data[collided_results->m_size] = iVar8;
        collided_results->m_size = collided_results->m_size + 1;
      }
      if ((bool)(~bVar18 & iVar8 < 0)) {
        iVar22 = iVar22 - *(int *)(*(long *)(this + 0x18) + 0x20 + lVar23 * 0x24);
      }
      else {
        iVar22 = iVar22 + 1;
      }
    } while (iVar22 < iVar7);
  }
  return 0 < collided_results->m_size;
}

Assistant:

SIMD_FORCE_INLINE int getNodeCount() const
	{
		return m_num_nodes;
	}